

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_mgga_xc_b88b95.c
# Opt level: O2

void xc_hyb_mgga_xc_x1b95_init(xc_func_type *p)

{
  double local_28 [4];
  
  local_28[0] = 0.2025;
  local_28[1] = 0.0705;
  local_28[2] = 1.0;
  xc_mix_init(p,3,xc_hyb_mgga_xc_x1b95_init::funcs_id,local_28);
  xc_hyb_init_hybrid(p,0.3);
  return;
}

Assistant:

void
xc_hyb_mgga_xc_x1b95_init(xc_func_type *p)
{
  const double a1=0.675, a2=0.235, a0=0.30;

  static int   funcs_id  [3] = {XC_GGA_X_B88, XC_GGA_X_PW91, XC_MGGA_C_BC95};
  double funcs_coef[3];

  funcs_coef[0] = a0*a1;
  funcs_coef[1] = a0*a2;
  funcs_coef[2] = 1.0;

  xc_mix_init(p, 3, funcs_id, funcs_coef);
  xc_hyb_init_hybrid(p, a0);
}